

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linktimeplugin.hpp
# Opt level: O0

vector<Animal_*,_std::allocator<Animal_*>_> * linktimeplugin::RegistrarBase<Animal>::plugins(void)

{
  bool bVar1;
  int iVar2;
  type this;
  reference ppRVar3;
  undefined4 extraout_var;
  vector<Animal_*,_std::allocator<Animal_*>_> *in_RDI;
  value_type local_50;
  RegistrarBase<Animal> *local_48;
  RegistrarBase<Animal> *r;
  iterator __end0;
  iterator __begin0;
  vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>
  *__range3;
  vector<Animal_*,_std::allocator<Animal_*>_> *ret;
  
  std::vector<Animal_*,_std::allocator<Animal_*>_>::vector(in_RDI);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&registrars_);
  if (bVar1) {
    this = std::
           unique_ptr<std::vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>,_std::default_delete<std::vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>_>_>
           ::operator*((unique_ptr<std::vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>,_std::default_delete<std::vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>_>_>
                        *)&registrars_);
    __end0 = std::
             vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>
             ::begin(this);
    r = (RegistrarBase<Animal> *)
        std::
        vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>
        ::end(this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<linktimeplugin::RegistrarBase<Animal>_**,_std::vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>_>
                                       *)&r), bVar1) {
      ppRVar3 = __gnu_cxx::
                __normal_iterator<linktimeplugin::RegistrarBase<Animal>_**,_std::vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>_>
                ::operator*(&__end0);
      local_48 = *ppRVar3;
      iVar2 = (*local_48->_vptr_RegistrarBase[2])();
      local_50 = (value_type)CONCAT44(extraout_var,iVar2);
      std::vector<Animal_*,_std::allocator<Animal_*>_>::push_back(in_RDI,&local_50);
      __gnu_cxx::
      __normal_iterator<linktimeplugin::RegistrarBase<Animal>_**,_std::vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>_>
      ::operator++(&__end0);
    }
  }
  return in_RDI;
}

Assistant:

static std::vector<BASE*> plugins() {
            std::vector<BASE*> ret;

            if (registrars_) {
                for(auto r : *registrars_) {
                    ret.push_back(&(*r)());
                }
            }

            return ret;
        }